

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeRUSBitpInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint Op2;
  uint Op1;
  uint local_20;
  uint local_1c;
  
  DVar1 = Decode2OpInstruction(Insn,&local_1c,&local_20);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,local_1c,Address,Decoder);
    if ((ulong)local_20 < 0xc) {
      MCOperand_CreateImm0(Inst,(ulong)*(uint *)(DecodeBitpOperand_Values + (ulong)local_20 * 4));
    }
    return MCDisassembler_Success;
  }
  DVar1 = Decode2OpInstructionFail(Inst,Insn,Address,Decoder);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeRUSBitpInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(Insn, &Op1, &Op2);
	if (S != MCDisassembler_Success)
		return Decode2OpInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeBitpOperand(Inst, Op2, Address, Decoder);

	return S;
}